

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void initAvgEq(Index *pIdx)

{
  IndexSample *pIVar1;
  int iVar2;
  ulong local_50;
  i64 nDist100;
  i64 nSum100;
  tRowcnt local_38;
  tRowcnt nRow;
  tRowcnt avgEq;
  tRowcnt sumEq;
  int i;
  int nSample;
  int nCol;
  int iCol;
  IndexSample *pFinal;
  IndexSample *aSample;
  Index *pIdx_local;
  
  if (pIdx != (Index *)0x0) {
    pIVar1 = pIdx->aSample;
    iVar2 = pIdx->nSample + -1;
    i = 1;
    if (1 < pIdx->nSampleCol) {
      i = pIdx->nSampleCol + -1;
      pIdx->aAvgEq[i] = 1;
    }
    for (nSample = 0; nSample < i; nSample = nSample + 1) {
      sumEq = pIdx->nSample;
      nRow = 0;
      local_38 = 0;
      nDist100 = 0;
      if (((pIdx->aiRowEst == (tRowcnt *)0x0) || ((int)(uint)pIdx->nKeyCol <= nSample)) ||
         (pIdx->aiRowEst[nSample + 1] == 0)) {
        nSum100._4_4_ = pIVar1[iVar2].anLt[nSample];
        local_50 = (ulong)pIVar1[iVar2].anDLt[nSample] * 100;
        sumEq = sumEq - 1;
      }
      else {
        nSum100._4_4_ = *pIdx->aiRowEst;
        local_50 = ((ulong)*pIdx->aiRowEst * 100) / (ulong)pIdx->aiRowEst[nSample + 1];
      }
      pIdx->nRowEst0 = nSum100._4_4_;
      for (avgEq = 0; (int)avgEq < (int)sumEq; avgEq = avgEq + 1) {
        if ((avgEq == pIdx->nSample - 1U) ||
           (pIVar1[(int)avgEq].anDLt[nSample] != pIVar1[(int)(avgEq + 1)].anDLt[nSample])) {
          nRow = pIVar1[(int)avgEq].anEq[nSample] + nRow;
          nDist100 = nDist100 + 100;
        }
      }
      if ((nDist100 < (long)local_50) && (nRow < nSum100._4_4_)) {
        local_38 = (tRowcnt)((long)((ulong)(nSum100._4_4_ - nRow) * 100) /
                            (long)(local_50 - nDist100));
      }
      if (local_38 == 0) {
        local_38 = 1;
      }
      pIdx->aAvgEq[nSample] = local_38;
    }
  }
  return;
}

Assistant:

static void initAvgEq(Index *pIdx){
  if( pIdx ){
    IndexSample *aSample = pIdx->aSample;
    IndexSample *pFinal = &aSample[pIdx->nSample-1];
    int iCol;
    int nCol = 1;
    if( pIdx->nSampleCol>1 ){
      /* If this is stat4 data, then calculate aAvgEq[] values for all
      ** sample columns except the last. The last is always set to 1, as
      ** once the trailing PK fields are considered all index keys are
      ** unique.  */
      nCol = pIdx->nSampleCol-1;
      pIdx->aAvgEq[nCol] = 1;
    }
    for(iCol=0; iCol<nCol; iCol++){
      int nSample = pIdx->nSample;
      int i;                    /* Used to iterate through samples */
      tRowcnt sumEq = 0;        /* Sum of the nEq values */
      tRowcnt avgEq = 0;
      tRowcnt nRow;             /* Number of rows in index */
      i64 nSum100 = 0;          /* Number of terms contributing to sumEq */
      i64 nDist100;             /* Number of distinct values in index */

      if( !pIdx->aiRowEst || iCol>=pIdx->nKeyCol || pIdx->aiRowEst[iCol+1]==0 ){
        nRow = pFinal->anLt[iCol];
        nDist100 = (i64)100 * pFinal->anDLt[iCol];
        nSample--;
      }else{
        nRow = pIdx->aiRowEst[0];
        nDist100 = ((i64)100 * pIdx->aiRowEst[0]) / pIdx->aiRowEst[iCol+1];
      }
      pIdx->nRowEst0 = nRow;

      /* Set nSum to the number of distinct (iCol+1) field prefixes that
      ** occur in the stat4 table for this index. Set sumEq to the sum of 
      ** the nEq values for column iCol for the same set (adding the value 
      ** only once where there exist duplicate prefixes).  */
      for(i=0; i<nSample; i++){
        if( i==(pIdx->nSample-1)
         || aSample[i].anDLt[iCol]!=aSample[i+1].anDLt[iCol] 
        ){
          sumEq += aSample[i].anEq[iCol];
          nSum100 += 100;
        }
      }

      if( nDist100>nSum100 && sumEq<nRow ){
        avgEq = ((i64)100 * (nRow - sumEq))/(nDist100 - nSum100);
      }
      if( avgEq==0 ) avgEq = 1;
      pIdx->aAvgEq[iCol] = avgEq;
    }
  }
}